

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeRepresentation.hpp
# Opt level: O0

double operator/(TimeRepresentation<count_time<9,_long>_> t1,
                TimeRepresentation<count_time<9,_long>_> t2)

{
  double dVar1;
  double dVar2;
  
  dVar1 = TimeRepresentation::operator_cast_to_double
                    ((TimeRepresentation<count_time<9,_long>_> *)0x55a978);
  dVar2 = TimeRepresentation::operator_cast_to_double
                    ((TimeRepresentation<count_time<9,_long>_> *)0x55a987);
  return dVar1 / dVar2;
}

Assistant:

inline double
    operator/(TimeRepresentation<Tconv> t1, TimeRepresentation<Tconv> t2)
{
    return static_cast<double>(t1) / static_cast<double>(t2);
}